

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O3

bool __thiscall
ritobin::io::impl_text_read::TextReader::read_number<unsigned_char>(TextReader *this,uchar *value)

{
  bool bVar1;
  char *__last;
  string_view sVar2;
  __integer_from_chars_result_type<unsigned_char> _Var3;
  
  sVar2 = read_word(this);
  if (sVar2._M_len == 0) {
    bVar1 = false;
  }
  else {
    __last = sVar2._M_str + sVar2._M_len;
    _Var3 = std::from_chars<unsigned_char>(sVar2._M_str,__last,value,10);
    bVar1 = _Var3.ptr == __last && _Var3.ec == 0;
  }
  return bVar1;
}

Assistant:

bool read_number(T& value) noexcept {
            static_assert (std::is_arithmetic_v<T>);
            auto const word = read_word();
            if (word.empty()) {
                return false;
            }
            return to_num(word, value);
        }